

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError PaUtil_GetHostApiRepresentation(PaUtilHostApiRepresentation **hostApi,PaHostApiTypeId type)

{
  int local_1c;
  PaError local_18;
  int i;
  PaError result;
  PaHostApiTypeId type_local;
  PaUtilHostApiRepresentation **hostApi_local;
  
  if (initializationCount_ == 0) {
    local_18 = -10000;
  }
  else {
    local_18 = -0x26fb;
    for (local_1c = 0; local_1c < hostApisCount_; local_1c = local_1c + 1) {
      if ((hostApis_[local_1c]->info).type == type) {
        *hostApi = hostApis_[local_1c];
        return 0;
      }
    }
  }
  return local_18;
}

Assistant:

PaError PaUtil_GetHostApiRepresentation( struct PaUtilHostApiRepresentation **hostApi,
        PaHostApiTypeId type )
{
    PaError result;
    int i;

    if( !PA_IS_INITIALISED_ )
    {
        result = paNotInitialized;
    }
    else
    {
        result = paHostApiNotFound;

        for( i=0; i < hostApisCount_; ++i )
        {
            if( hostApis_[i]->info.type == type )
            {
                *hostApi = hostApis_[i];
                result = paNoError;
                break;
            }
        }
    }

    return result;
}